

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppm_image.hpp
# Opt level: O2

ssize_t __thiscall sisl::utility::ppm_image::write(ppm_image *this,int __fd,void *__buf,size_t __n)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  double *__ptr;
  ostream *poVar6;
  DenseStorage<double,__1,__1,_1,_0> *other;
  Scalar *pSVar7;
  int iVar8;
  uint d0;
  undefined4 in_register_00000034;
  vector min_max;
  vector pix;
  Scalar local_238;
  ofstream fp;
  undefined4 uStack_22c;
  int aiStack_210 [120];
  
  _fp = (Matrix<double,__1,_1,_0,__1,_1> *)CONCAT44(uStack_22c,2);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&min_max,(int *)&fp);
  if ((int)__buf == 0) {
    pix.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::CommaInitializer
              ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&fp,&min_max,
               (Scalar *)&pix);
    local_238 = 1.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
              ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&fp,&local_238);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::finished
              ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&fp);
  }
  else {
    calc_minmax((ppm_image *)&fp);
    __ptr = min_max.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    min_max.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)_fp;
    _fp = (Matrix<double,__1,_1,_0,__1,_1> *)__ptr;
    free(__ptr);
  }
  std::ofstream::ofstream(&fp,*(char **)CONCAT44(in_register_00000034,__fd),_S_out|_S_bin);
  iVar5 = *(int *)((long)aiStack_210 +
                  _fp[-2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows);
  if (iVar5 == 0) {
    poVar6 = std::operator<<((ostream *)&fp,"P3");
    std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&fp,this->m_iWidth);
    poVar6 = std::operator<<(poVar6," ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->m_iHeight);
    std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<((ostream *)&fp,"255");
    std::endl<char,std::char_traits<char>>(poVar6);
    for (iVar8 = 0; iVar8 < this->m_iHeight; iVar8 = iVar8 + 1) {
      for (d0 = 0; (int)d0 < this->m_iWidth; d0 = d0 + 1) {
        other = (DenseStorage<double,__1,__1,_1,_0> *)
                array_n<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_2,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                ::operator()(&this->m_aArray,d0);
        Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                  ((DenseStorage<double,__1,__1,_1,_0> *)&pix,other);
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&min_max,1
                           );
        dVar1 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&min_max,0
                           );
        if (1e-06 <= ABS(dVar1 - *pSVar7) || (char)__buf != '\x01') {
          pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&pix,0);
          dVar1 = *pSVar7;
          pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&min_max
                              ,0);
          dVar2 = *pSVar7;
          pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&min_max
                              ,1);
          dVar3 = *pSVar7;
          pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&min_max
                              ,0);
          dVar4 = *pSVar7;
          pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&pix,0);
          *pSVar7 = ((dVar1 - dVar2) * 255.0) / (dVar3 - dVar4);
          pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&pix,1);
          dVar1 = *pSVar7;
          pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&min_max
                              ,0);
          dVar2 = *pSVar7;
          pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&min_max
                              ,1);
          dVar3 = *pSVar7;
          pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&min_max
                              ,0);
          dVar4 = *pSVar7;
          pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&pix,1);
          *pSVar7 = ((dVar1 - dVar2) * 255.0) / (dVar3 - dVar4);
          pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&pix,2);
          dVar1 = *pSVar7;
          pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&min_max
                              ,0);
          dVar2 = *pSVar7;
          pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&min_max
                              ,1);
          dVar3 = *pSVar7;
          pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&min_max
                              ,0);
          dVar4 = *pSVar7;
          pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&pix,2);
          *pSVar7 = ((dVar1 - dVar2) * 255.0) / (dVar3 - dVar4);
        }
        else {
          pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&pix,2);
          *pSVar7 = 0.0;
          pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&pix,1);
          *pSVar7 = 0.0;
          pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&pix,0);
          *pSVar7 = 0.0;
        }
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&pix,0);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&fp,(int)*pSVar7);
        poVar6 = std::operator<<(poVar6," ");
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&pix,1);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)*pSVar7);
        poVar6 = std::operator<<(poVar6," ");
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&pix,2);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)*pSVar7);
        std::endl<char,std::char_traits<char>>(poVar6);
        free(pix.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
      }
    }
    std::ofstream::close();
  }
  std::ofstream::~ofstream(&fp);
  free(min_max.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return (ulong)CONCAT31((int3)((uint)iVar5 >> 8),iVar5 == 0);
}

Assistant:

bool write(const std::string &out, bool normalize = true) {
                using namespace std;
                vector min_max(2);

                if(!normalize) {
                    min_max << 0, 1.;
                }else {
                    min_max = calc_minmax();
    
                }

                // open file and check if it's valid
                ofstream fp(out.c_str(), ios::out | ios::binary);
                if(!fp.good()) return false;

                // write the header
                fp << "P3" << endl;
                fp << m_iWidth << " " << m_iHeight << endl;
                fp << "255" << endl;

                // Write image data
                for(int i = 0; i < m_iHeight; i++) {
                    for(int j = 0; j < m_iWidth; j++) {
                        vector pix = m_aArray(j,i);

                        // If min/max are equal, and we're normalizing, this is just blank
                        if(abs(min_max[1] - min_max[0]) < 1e-6 && normalize) {
                            pix[0] = pix[1] = pix[2] = 0.;
                        } else {
                            pix[0] = 255. * (pix[0] - min_max[0])/(min_max[1] - min_max[0]);
                            pix[1] = 255. * (pix[1] - min_max[0])/(min_max[1] - min_max[0]);
                            pix[2] = 255. * (pix[2] - min_max[0])/(min_max[1] - min_max[0]);
                        }
                        fp << (int)pix[0] << " " << (int)pix[1] << " " << (int)pix[2] << endl;
                    }
                }
                fp.close();
                return true;
            }